

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_trace.c
# Opt level: O2

void trace_end_(long *proc)

{
  ulong uVar1;
  FILE *__stream;
  unsigned_long uVar2;
  ulong uVar3;
  ulong uVar4;
  char fname [10];
  char local_3a [10];
  
  sprintf(local_3a,"%03d",(ulong)(uint)*proc);
  __stream = fopen(local_3a,"w");
  uVar4 = 0;
  while( true ) {
    uVar2 = MAX_EVENTS;
    if (current < MAX_EVENTS) {
      uVar2 = current;
    }
    if (uVar2 <= uVar4) break;
    fprintf(__stream,"%d ",(ulong)(uint)*proc);
    uVar3 = uVar4 * 6;
    uVar1 = uVar3 + 6;
    for (; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      fprintf(__stream,"%d ",(ulong)*(uint *)(indlog + uVar3));
    }
    fprintf(__stream,"%ld %ld\n",tlog[uVar4 * 2],tlog[uVar4 * 2 + 1]);
    uVar4 = uVar4 + 1;
  }
  MA_pop_stack(gahandle);
  MA_pop_stack(ihandle);
  MA_pop_stack(thandle);
  fclose(__stream);
  return;
}

Assistant:

void trace_end_(long *proc)
{
    FILE *fout;
    char fname[10];
    unsigned long i,k;
    
    sprintf(fname,"%03d",(int)*proc);
    fout=fopen(fname,"w");
    
    for(i=0;i<min(current,MAX_EVENTS);i++){
        fprintf(fout,"%d ",(int)*proc);
        for(k=i*6;k<6*(i+1);k++)fprintf(fout,"%d ",(int)indlog[k]);
        fprintf(fout,"%ld %ld\n",(unsigned long)tlog[i*2],
                (unsigned long)tlog[i*2+1]);
    }

    MA_pop_stack(gahandle);
    MA_pop_stack(ihandle);
    MA_pop_stack(thandle);
    
    fclose(fout);
}